

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_number.cpp
# Opt level: O1

int ON_ParseLengthExpression
              (wchar_t *str,int str_count,ON_ParseSettings parse_settings,double *length_value,
              ON_ParseSettings *parse_results,LengthUnitSystem *str_length_unit_system)

{
  wchar_t *pwVar1;
  double dVar2;
  ON_ParseSettings OVar3;
  ON_ParseSettings parse_settings_00;
  ON__UINT32 aOVar4 [2];
  ON__UINT32 aOVar5 [2];
  undefined8 uVar6;
  ON__UINT16 OVar7;
  ON__UINT8 OVar8;
  ON__UINT8 OVar9;
  ON__UINT64 OVar10;
  undefined8 uVar11;
  bool bVar12;
  char cVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  LengthUnitSystem *pLVar17;
  int iVar18;
  int iVar19;
  ON_ParseSettings *pOVar20;
  ulong uVar21;
  double *pdVar22;
  double x;
  ON_ParseSettings pr;
  ON_ParseSettings input_parse_settings;
  double inches_value;
  ON_ParseSettings inches_pr;
  ON_ParseSettings parse_inches;
  ON_ParseSettings parse_unit_name_settings;
  LengthUnitSystem local_112;
  LengthUnitSystem local_111;
  ON_ParseSettings *local_110;
  double local_108;
  LengthUnitSystem *local_100;
  ON_ParseSettings local_f8;
  wchar_t *local_d8;
  double *local_d0;
  ON_ParseSettings local_c8;
  double local_a0;
  ON_ParseSettings local_98;
  ON_ParseSettings local_78;
  ON_ParseSettings local_58;
  
  OVar3 = parse_settings;
  OVar10 = ON_ParseSettings::FalseSettings.m_reserved;
  uVar6 = ON_ParseSettings::FalseSettings._16_8_;
  aOVar5 = ON_ParseSettings::FalseSettings.m_false_default_bits;
  aOVar4 = ON_ParseSettings::FalseSettings.m_true_default_bits;
  local_108 = -1.23432101234321e+308;
  local_112 = None;
  local_c8.m_reserved_bits = parse_settings.m_reserved_bits;
  local_c8.m_context_locale_id = parse_settings.m_context_locale_id;
  local_c8.m_context_angle_unit_system = parse_settings.m_context_angle_unit_system;
  local_c8.m_context_length_unit_system = parse_settings.m_context_length_unit_system;
  local_c8.m_reserved = parse_settings.m_reserved;
  local_c8.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
  local_c8.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
  local_c8.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
  local_c8.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
  local_f8._16_8_ = ON_ParseSettings::FalseSettings._16_8_;
  local_f8.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
  local_f8.m_true_default_bits = ON_ParseSettings::FalseSettings.m_true_default_bits;
  local_f8.m_false_default_bits = ON_ParseSettings::FalseSettings.m_false_default_bits;
  if (length_value != (double *)0x0) {
    *length_value = -1.23432101234321e+308;
  }
  if (str_length_unit_system != (LengthUnitSystem *)0x0) {
    *str_length_unit_system = None;
  }
  uVar11 = ON_ParseSettings::FalseSettings._16_8_;
  if (parse_results != (ON_ParseSettings *)0x0) {
    ON_ParseSettings::FalseSettings.m_reserved_bits = (ON__UINT32)uVar6;
    ON_ParseSettings::FalseSettings.m_context_locale_id = SUB82(uVar6,4);
    OVar7 = ON_ParseSettings::FalseSettings.m_context_locale_id;
    ON_ParseSettings::FalseSettings.m_context_angle_unit_system = SUB81(uVar6,6);
    OVar8 = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    ON_ParseSettings::FalseSettings.m_context_length_unit_system = SUB81(uVar6,7);
    OVar9 = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    parse_results->m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    ON_ParseSettings::FalseSettings._16_8_ = uVar11;
    parse_results->m_context_locale_id = OVar7;
    parse_results->m_context_angle_unit_system = OVar8;
    parse_results->m_context_length_unit_system = OVar9;
    parse_results->m_reserved = OVar10;
    *&parse_results->m_true_default_bits = aOVar4;
    *&parse_results->m_false_default_bits = aOVar5;
  }
  uVar14 = ON_ParseNumberExpression(str,str_count,OVar3,&local_f8,&local_108);
  uVar15 = 0;
  if (0 < (int)uVar14) {
    if (str_count == -1) {
      iVar18 = -1;
    }
    else {
      iVar18 = str_count - uVar14;
      if (str_count < (int)uVar14) {
        return 0;
      }
    }
    local_110 = parse_results;
    local_100 = str_length_unit_system;
    local_d0 = length_value;
    if (((int)uVar14 < iVar18 || iVar18 == -1) &&
       (bVar12 = ON_ParseSettings::ParseWhiteSpaceBetweenValueAndUnitSystem(&local_c8), bVar12)) {
      bVar12 = ON_ParseSettings::IsInteriorWhiteSpace(&local_c8,str[uVar14]);
    }
    else {
      bVar12 = false;
    }
    local_58.m_reserved_bits = local_c8.m_reserved_bits;
    local_58.m_context_locale_id = local_c8.m_context_locale_id;
    local_58.m_context_angle_unit_system = local_c8.m_context_angle_unit_system;
    local_58.m_context_length_unit_system = local_c8.m_context_length_unit_system;
    local_58.m_reserved = local_c8.m_reserved;
    local_58.m_true_default_bits[0] = local_c8.m_true_default_bits[0];
    local_58.m_true_default_bits[1] = local_c8.m_true_default_bits[1];
    local_58.m_false_default_bits[0] = local_c8.m_false_default_bits[0];
    local_58.m_false_default_bits[1] = local_c8.m_false_default_bits[1];
    ON_ParseSettings::SetParseLeadingWhiteSpace(&local_58,false);
    ON_ParseSettings::SetParseWhiteSpaceBetweenValueAndUnitSystem(&local_58,bVar12);
    OVar3.m_false_default_bits[0] = local_58.m_false_default_bits[0];
    OVar3.m_false_default_bits[1] = local_58.m_false_default_bits[1];
    OVar3.m_true_default_bits[0] = local_58.m_true_default_bits[0];
    OVar3.m_true_default_bits[1] = local_58.m_true_default_bits[1];
    OVar3.m_reserved_bits = local_58.m_reserved_bits;
    OVar3.m_context_locale_id = local_58.m_context_locale_id;
    OVar3.m_context_angle_unit_system = local_58.m_context_angle_unit_system;
    OVar3.m_context_length_unit_system = local_58.m_context_length_unit_system;
    OVar3.m_reserved = local_58.m_reserved;
    iVar16 = ON_ParseLengthUnitName(str + uVar14,iVar18,OVar3,&local_112);
    pdVar22 = local_d0;
    pOVar20 = local_110;
    if (iVar16 < 1) {
      local_112 = None;
      pLVar17 = local_100;
      uVar15 = uVar14;
    }
    else {
      if (iVar18 == -1) {
        iVar19 = -1;
      }
      else {
        iVar19 = iVar18 - iVar16;
        if (iVar18 < iVar16) {
          return 0;
        }
      }
      uVar15 = iVar16 + uVar14;
      ON_ParseSettings::SetParseWhiteSpaceBetweenValueAndUnitSystem(&local_f8,bVar12);
      pLVar17 = local_100;
      if ((iVar19 == -1 || 0 < iVar19) && (local_112 == Feet)) {
        local_d8 = (wchar_t *)local_108;
        dVar2 = floor(local_108);
        if ((((dVar2 == (double)local_d8) &&
             (((!NAN(dVar2) && !NAN((double)local_d8) &&
               (bVar12 = ON_ParseSettings::ParseFeetInches(&local_c8), bVar12)) &&
              (bVar12 = ON_ParseSettings::ParseSignificandDecimalPoint(&local_f8), !bVar12)))) &&
            (((bVar12 = ON_ParseSettings::ParseScientificENotation(&local_f8), !bVar12 &&
              (bVar12 = ON_ParseSettings::ParseRationalNumber(&local_f8), !bVar12)) &&
             (bVar12 = ON_ParseSettings::ParseMultiplication(&local_f8), !bVar12)))) &&
           (((bVar12 = ON_ParseSettings::ParseDivision(&local_f8), !bVar12 &&
             (bVar12 = ON_ParseSettings::ParsePi(&local_f8), !bVar12)) &&
            (bVar12 = ON_ParseSettings::ParseIntegerDashFraction(&local_f8), !bVar12)))) {
          local_78.m_reserved_bits = local_c8.m_reserved_bits;
          local_78.m_context_locale_id = local_c8.m_context_locale_id;
          local_78.m_context_angle_unit_system = local_c8.m_context_angle_unit_system;
          local_78.m_context_length_unit_system = local_c8.m_context_length_unit_system;
          local_78.m_reserved = local_c8.m_reserved;
          local_78.m_true_default_bits[0] = local_c8.m_true_default_bits[0];
          local_78.m_true_default_bits[1] = local_c8.m_true_default_bits[1];
          local_78.m_false_default_bits[0] = local_c8.m_false_default_bits[0];
          local_78.m_false_default_bits[1] = local_c8.m_false_default_bits[1];
          DisableStartAndExpressionParsingStuff(&local_78);
          ON_ParseSettings::SetParsePi(&local_78,false);
          ON_ParseSettings::SetParseFeetInches(&local_78,false);
          local_a0 = -1.23432101234321e+308;
          local_111 = None;
          local_98.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
          local_98.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
          local_98.m_context_angle_unit_system =
               ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
          local_98.m_context_length_unit_system =
               ON_ParseSettings::FalseSettings.m_context_length_unit_system;
          local_98.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
          local_98.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
          local_98.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
          local_98.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0]
          ;
          local_98.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1]
          ;
          pwVar1 = str + uVar15;
          local_d8 = str;
          bVar12 = ON_ParseSettings::IsNumberDash(&local_c8,*pwVar1);
          if ((bVar12) && (iVar19 == -1 || 2 < iVar19)) {
            cVar13 = ON_ParseSettings::IsDigit(&local_c8,pwVar1[1]);
            uVar21 = (ulong)(cVar13 != '\0');
            iVar18 = iVar19 + -1;
            if (iVar19 == -1) {
              iVar18 = iVar19;
            }
          }
          else {
            uVar21 = 0;
            iVar18 = iVar19;
          }
          iVar16 = (int)uVar21;
          if ((iVar16 == 0) && (iVar18 == -1 || 2 < iVar18)) {
            if ((((int)uVar15 < iVar18) || (iVar18 == -1)) &&
               (bVar12 = ON_ParseSettings::ParseWhiteSpaceBetweenFeetAndInches(&local_c8), bVar12))
            {
              bVar12 = ON_ParseSettings::IsInteriorWhiteSpace(&local_c8,*pwVar1);
            }
            else {
              bVar12 = false;
            }
            ON_ParseSettings::SetParseLeadingWhiteSpace(&local_78,bVar12);
          }
          else {
            bVar12 = false;
          }
          parse_settings_00.m_false_default_bits[0] = local_78.m_false_default_bits[0];
          parse_settings_00.m_false_default_bits[1] = local_78.m_false_default_bits[1];
          parse_settings_00.m_true_default_bits[0] = local_78.m_true_default_bits[0];
          parse_settings_00.m_true_default_bits[1] = local_78.m_true_default_bits[1];
          parse_settings_00.m_reserved_bits = local_78.m_reserved_bits;
          parse_settings_00.m_context_locale_id = local_78.m_context_locale_id;
          parse_settings_00.m_context_angle_unit_system = local_78.m_context_angle_unit_system;
          parse_settings_00.m_context_length_unit_system = local_78.m_context_length_unit_system;
          parse_settings_00.m_reserved = local_78.m_reserved;
          iVar18 = ON_ParseLengthExpression
                             (pwVar1 + uVar21,iVar18,parse_settings_00,&local_a0,&local_98,
                              &local_111);
          uVar14 = (uint)((ulong)local_a0 >> 0x20);
          if (((local_111 == None && iVar18 != 0) && (0.0 <= local_a0 && local_a0 < 12.0)) &&
             ((uint)(local_d8[iVar16 + uVar15] + L'\xffffffd0') < 10)) {
            local_111 = Inches;
          }
          pLVar17 = local_100;
          pOVar20 = local_110;
          pdVar22 = local_d0;
          if ((local_111 == Inches && iVar18 != 0) && (0.0 <= local_a0 && local_a0 < 12.0)) {
            if (0.0 < local_a0 && local_108 < 0.0) {
              uVar14 = uVar14 ^ 0x80000000;
            }
            uVar15 = iVar16 + uVar15 + iVar18;
            local_108 = local_108 * 12.0 + (double)CONCAT44(uVar14,SUB84(local_a0,0));
            local_112 = Inches;
            ON_ParseSettings::SetParseFeetInches(&local_f8,true);
            ON_ParseSettings::SetParseLeadingWhiteSpace(&local_98,false);
            ON_ParseSettings::operator|=(&local_f8,&local_98);
            ON_ParseSettings::SetParseWhiteSpaceBetweenFeetAndInches(&local_f8,bVar12);
            pLVar17 = local_100;
            pOVar20 = local_110;
            pdVar22 = local_d0;
          }
        }
      }
    }
    if (pdVar22 != (double *)0x0) {
      *pdVar22 = local_108;
    }
    if (pOVar20 != (ON_ParseSettings *)0x0) {
      pOVar20->m_reserved_bits = local_f8.m_reserved_bits;
      pOVar20->m_context_locale_id = local_f8.m_context_locale_id;
      pOVar20->m_context_angle_unit_system = local_f8.m_context_angle_unit_system;
      pOVar20->m_context_length_unit_system = local_f8.m_context_length_unit_system;
      pOVar20->m_reserved = local_f8.m_reserved;
      *&pOVar20->m_true_default_bits = local_f8.m_true_default_bits;
      *&pOVar20->m_false_default_bits = local_f8.m_false_default_bits;
    }
    if (pLVar17 != (LengthUnitSystem *)0x0) {
      *pLVar17 = local_112;
    }
  }
  return uVar15;
}

Assistant:

int ON_ParseLengthExpression( 
  const wchar_t* str,
  int str_count,
  ON_ParseSettings parse_settings,
  double* length_value,
  ON_ParseSettings* parse_results,
  ON::LengthUnitSystem* str_length_unit_system
  )
{
  double x = ON_UNSET_VALUE;
  ON::LengthUnitSystem length_us = ON::LengthUnitSystem::None;
  const ON_ParseSettings input_parse_settings(parse_settings);
  ON_ParseSettings pr = ON_ParseSettings::FalseSettings;
  if ( 0 != length_value )
    *length_value = ON_UNSET_VALUE;
  if ( 0 != str_length_unit_system )
    *str_length_unit_system = length_us;
  if ( 0 != parse_results )
    *parse_results = pr;

  int str_index = ON_ParseNumberExpression(str,str_count,input_parse_settings,&pr,&x);
  if ( str_index <= 0 )
    return 0;

  if ( -1 != str_count )
  {
    if (str_index > str_count )
      return 0;
    str_count -= str_index;
  }

  const bool bParseWhiteSpaceBetweenValueAndUnitSystem
    = (str_index < str_count || -1 == str_count)
    && input_parse_settings.ParseWhiteSpaceBetweenValueAndUnitSystem()
    && input_parse_settings.IsInteriorWhiteSpace(str[str_index]);
  ON_ParseSettings parse_unit_name_settings(input_parse_settings);
  parse_unit_name_settings.SetParseLeadingWhiteSpace(false);
  parse_unit_name_settings.SetParseWhiteSpaceBetweenValueAndUnitSystem(bParseWhiteSpaceBetweenValueAndUnitSystem);
  
  const int end_of_unit_index = ON_ParseLengthUnitName(
    str+str_index,
    str_count,
    parse_unit_name_settings,
    &length_us
  );

  if ( end_of_unit_index > 0 )
  {
    if ( -1 != str_count )
    {
      if (end_of_unit_index > str_count )
        return 0;
      str_count -= end_of_unit_index;
    }
    str_index += end_of_unit_index;

    pr.SetParseWhiteSpaceBetweenValueAndUnitSystem(bParseWhiteSpaceBetweenValueAndUnitSystem);

    if ( -1 == str_count || str_count > 0 )
    {
      if ( ON::LengthUnitSystem::Feet == length_us 
           && floor(x) == x
           && input_parse_settings.ParseFeetInches() 
           && false == pr.ParseSignificandDecimalPoint()
           && false == pr.ParseScientificENotation()
           && false == pr.ParseRationalNumber()
           && false == pr.ParseMultiplication()
           && false == pr.ParseDivision()
           && false == pr.ParsePi()
           && false == pr.ParseIntegerDashFraction()
         )
      {
        // parse inches part or feet and inches
        int inches_index0 = str_index;
        ON_ParseSettings parse_inches = input_parse_settings;
        DisableStartAndExpressionParsingStuff(parse_inches);
        parse_inches.SetParsePi(false);
        parse_inches.SetParseFeetInches(false);

        double inches_value = ON_UNSET_VALUE;
        ON::LengthUnitSystem inches_us = ON::LengthUnitSystem::None;
        ON_ParseSettings inches_pr = ON_ParseSettings::FalseSettings;


        // Dale Lear 9 April 2014 - fix RH-23095 
        //  Checking for a number dash is required to parse 1'-1-1/2" as 13.5 inches.
        int number_dash_count = 0;
        if ( input_parse_settings.IsNumberDash(str[inches_index0]) )
        {
          // It is intentional that the "number dash" between feet and inches
          // cannot have leading or trailing interior space.
          if (-1 == str_count || str_count >= 3)
          {
            if ( input_parse_settings.IsDigit(str[inches_index0 + 1]) )
              number_dash_count = 1;
            if (-1 != str_count)
              str_count--;
          }
        }


        // June 10, 2016 Dale Lear
        // http://mcneel.myjetbrains.com/youtrack/issue/RH-34577
        //  Allow embedded interior white space between the feet and inches.
        //  Example <1' 3"> should parse as 15 inches.
        bool bParseWhiteSpaceBetweenFeetAndInches = false;
        if (0 == number_dash_count)
        {
          if (-1 == str_count || str_count >= 3)
          {
            bParseWhiteSpaceBetweenFeetAndInches
              = (str_index < str_count || -1 == str_count)
              && input_parse_settings.ParseWhiteSpaceBetweenFeetAndInches()
              && input_parse_settings.IsInteriorWhiteSpace(str[inches_index0]);
            parse_inches.SetParseLeadingWhiteSpace(bParseWhiteSpaceBetweenFeetAndInches);
          }
        }

        int end_of_inches_index = ON_ParseLengthExpression(
          str + inches_index0 + number_dash_count,
          str_count,
          parse_inches,&inches_value,&inches_pr,&inches_us);

        if (
          end_of_inches_index > 0
          && ON::LengthUnitSystem::None == inches_us
          && inches_value >= 0.0
          && inches_value < 12.0
          && str[inches_index0 + number_dash_count] >= '0'
          && str[inches_index0 + number_dash_count] <= '9'
          )
        {
          // "lazy" inches format 1'6 is parsed as 1'6"
          inches_us = ON::LengthUnitSystem::Inches;
        }

        if ( end_of_inches_index > 0 
             && ON::LengthUnitSystem::Inches == inches_us
             && inches_value >= 0.0 // Dale Lear: 1'0" parses as 12 inches http://mcneel.myjetbrains.com/youtrack/issue/RH-34577
             && inches_value < 12.0
           )
        {
          // result of correctly adjusting str_count is never used.
          //if ( -1 != str_count)
          //  str_count -= end_of_inches_index;
          str_index = inches_index0 + end_of_inches_index + number_dash_count;
          if ( x < 0.0 && inches_value > 0.0 )
            x = x*12.0 - inches_value;
          else
            x = x*12.0 + inches_value;
          length_us = ON::LengthUnitSystem::Inches;
          pr.SetParseFeetInches(true);
          inches_pr.SetParseLeadingWhiteSpace(false);
          pr |= inches_pr;
          pr.SetParseWhiteSpaceBetweenFeetAndInches(bParseWhiteSpaceBetweenFeetAndInches);
        }
      }
    }
  }
  else
  {
    length_us = ON::LengthUnitSystem::None;
  }

  if ( length_value )
    *length_value = x;
  if ( 0 != parse_results )
    *parse_results = pr;
  if ( 0 != str_length_unit_system )
    *str_length_unit_system = length_us;

  return str_index;
}